

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void fillTensor<unsigned_int>
               (vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                *tensor,uint value)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  auVar6 = _DAT_001187e0;
  auVar5 = _DAT_001187d0;
  auVar4 = _DAT_001187c0;
  pvVar1 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(tensor->
                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar7 != 0) {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    lVar8 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar8].
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar9 = (long)*(pointer *)
                     ((long)&pvVar1[lVar8].
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar2;
      if (lVar9 != 0) {
        lVar9 = (lVar9 >> 3) * -0x5555555555555555;
        lVar10 = 0;
        do {
          lVar3 = *(long *)(lVar2 + lVar10 * 0x18);
          lVar11 = *(long *)(lVar2 + 8 + lVar10 * 0x18) - lVar3;
          if (lVar11 != 0) {
            lVar11 = lVar11 >> 2;
            lVar11 = lVar11 + (ulong)(lVar11 == 0);
            lVar12 = lVar11 + -1;
            auVar14._8_4_ = (int)lVar12;
            auVar14._0_8_ = lVar12;
            auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar14 = auVar14 ^ auVar6;
            uVar13 = 0;
            auVar16 = auVar5;
            auVar17 = auVar4;
            do {
              auVar18 = auVar16 ^ auVar6;
              iVar15 = auVar14._4_4_;
              if ((bool)(~(auVar18._4_4_ == iVar15 && auVar14._0_4_ < auVar18._0_4_ ||
                          iVar15 < auVar18._4_4_) & 1)) {
                *(uint *)(lVar3 + uVar13 * 4) = value;
              }
              if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
                  auVar18._12_4_ <= auVar14._12_4_) {
                *(uint *)(lVar3 + 4 + uVar13 * 4) = value;
              }
              iVar19 = SUB164(auVar17 ^ auVar6,4);
              if (iVar19 <= iVar15 &&
                  (iVar19 != iVar15 || SUB164(auVar17 ^ auVar6,0) <= auVar14._0_4_)) {
                *(uint *)(lVar3 + 8 + uVar13 * 4) = value;
                *(uint *)(lVar3 + 0xc + uVar13 * 4) = value;
              }
              uVar13 = uVar13 + 4;
              lVar12 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 4;
              auVar16._8_8_ = lVar12 + 4;
              lVar12 = auVar17._8_8_;
              auVar17._0_8_ = auVar17._0_8_ + 4;
              auVar17._8_8_ = lVar12 + 4;
            } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar13);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar9 + (ulong)(lVar9 == 0));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
  }
  return;
}

Assistant:

void fillTensor(std::vector<std::vector<std::vector<T> > > &tensor, T value){
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            for(int k=0; k<tensor[i][j].size(); k++){
                tensor[i][j][k] = value;
            }
        }
    }
}